

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash.c
# Opt level: O0

void p_crypto_hash_get_digest(PCryptoHash *hash,puchar *buf,psize *len)

{
  puchar *__src;
  puchar *digest;
  psize *len_local;
  puchar *buf_local;
  PCryptoHash *hash_local;
  
  if (len != (psize *)0x0) {
    if (hash == (PCryptoHash *)0x0 || buf == (puchar *)0x0) {
      *len = 0;
    }
    else if (*len < (ulong)hash->hash_len) {
      *len = 0;
    }
    else {
      if (hash->closed == 0) {
        (*hash->finish)(hash->context);
        hash->closed = 1;
      }
      __src = (*hash->digest)(hash->context);
      if (__src == (puchar *)0x0) {
        *len = 0;
      }
      else {
        memcpy(buf,__src,(ulong)hash->hash_len);
        *len = (ulong)hash->hash_len;
      }
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_crypto_hash_get_digest (PCryptoHash *hash, puchar *buf, psize *len)
{
	const puchar *digest;

	if (P_UNLIKELY (len == NULL))
		return;

	if (P_UNLIKELY (hash == NULL || buf == NULL)) {
		*len = 0;
		return;
	}

	if (P_UNLIKELY (hash->hash_len > *len)) {
		*len = 0;
		return;
	}

	if (!hash->closed) {
		hash->finish (hash->context);
		hash->closed = TRUE;
	}

	if (P_UNLIKELY ((digest = hash->digest (hash->context)) == NULL)) {
		*len = 0;
		return;
	}

	memcpy (buf, digest, hash->hash_len);
	*len = hash->hash_len;
}